

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall diligent_spirv_cross::Compiler::analyze_interlocked_resource_usage(Compiler *this)

{
  unordered_map<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>_>_>
  *this_00;
  FunctionID *__k;
  uint32_t uVar1;
  undefined8 uVar2;
  __node_base_ptr p_Var3;
  const_iterator cVar4;
  SPIRFunction *pSVar5;
  byte bVar6;
  ulong uVar7;
  InterlockedResourceAccessPrepassHandler prepass_handler;
  InterlockedResourceAccessHandler handler;
  OpcodeHandler local_e0;
  Compiler *local_d8;
  undefined8 local_d0;
  undefined2 local_c8;
  SmallVector<unsigned_int,_8UL> local_c0;
  OpcodeHandler local_88;
  Compiler *local_80;
  undefined1 local_78;
  undefined8 local_74;
  SmallVector<unsigned_int,_8UL> local_68;
  
  this_00 = &(this->ir).entry_points;
  __k = &(this->ir).default_entry_point;
  uVar7 = (ulong)(this->ir).default_entry_point.id;
  p_Var3 = ::std::
           _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&this_00->_M_h,uVar7 % (this->ir).entry_points._M_h._M_bucket_count,__k,uVar7)
  ;
  if (*(int *)&p_Var3->_M_nxt[0x1f]._M_nxt == 4) {
    uVar7 = (ulong)(this->ir).default_entry_point.id;
    p_Var3 = ::std::
             _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::_M_find_before_node
                       (&this_00->_M_h,uVar7 % (this->ir).entry_points._M_h._M_bucket_count,__k,
                        uVar7);
    local_e0._vptr_OpcodeHandler._0_4_ = 0x14f6;
    cVar4 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                    *)(p_Var3->_M_nxt + 0x13),(key_type *)&local_e0);
    if (cVar4.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
      uVar7 = (ulong)(this->ir).default_entry_point.id;
      p_Var3 = ::std::
               _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::_M_find_before_node
                         (&this_00->_M_h,uVar7 % (this->ir).entry_points._M_h._M_bucket_count,__k,
                          uVar7);
      local_e0._vptr_OpcodeHandler._0_4_ = 0x14f7;
      cVar4 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)(p_Var3->_M_nxt + 0x13),(key_type *)&local_e0);
      if (cVar4.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        uVar7 = (ulong)(this->ir).default_entry_point.id;
        p_Var3 = ::std::
                 _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::_M_find_before_node
                           (&this_00->_M_h,uVar7 % (this->ir).entry_points._M_h._M_bucket_count,__k,
                            uVar7);
        local_e0._vptr_OpcodeHandler._0_4_ = 0x14f8;
        cVar4 = ::std::
                _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)(p_Var3->_M_nxt + 0x13),(key_type *)&local_e0);
        if (cVar4.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
          uVar7 = (ulong)(this->ir).default_entry_point.id;
          p_Var3 = ::std::
                   _Hashtable<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>,_diligent_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::_M_find_before_node
                             (&this_00->_M_h,uVar7 % (this->ir).entry_points._M_h._M_bucket_count,
                              __k,uVar7);
          local_e0._vptr_OpcodeHandler._0_4_ = 0x14f9;
          cVar4 = ::std::
                  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                          *)(p_Var3->_M_nxt + 0x13),(key_type *)&local_e0);
          if (cVar4.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
            return;
          }
        }
      }
    }
    uVar1 = (this->ir).default_entry_point.id;
    local_e0._vptr_OpcodeHandler =
         (_func_int **)&PTR__InterlockedResourceAccessPrepassHandler_009228b8;
    local_c0.super_VectorView<unsigned_int>.buffer_size = 0;
    local_d0 = 0;
    local_c8 = 0;
    local_c0.buffer_capacity = 8;
    local_d8 = this;
    local_c0.super_VectorView<unsigned_int>.ptr = (uint *)&local_c0.stack_storage;
    SmallVector<unsigned_int,_8UL>::reserve(&local_c0,1);
    *(uint32_t *)
     ((char *)local_c0.super_VectorView<unsigned_int>.ptr +
     local_c0.super_VectorView<unsigned_int>.buffer_size * 4) = uVar1;
    local_c0.super_VectorView<unsigned_int>.buffer_size =
         local_c0.super_VectorView<unsigned_int>.buffer_size + 1;
    pSVar5 = Variant::get<diligent_spirv_cross::SPIRFunction>
                       ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                        (this->ir).default_entry_point.id);
    traverse_all_reachable_opcodes(this,pSVar5,&local_e0);
    uVar1 = (this->ir).default_entry_point.id;
    local_88._vptr_OpcodeHandler = (_func_int **)&PTR__InterlockedResourceAccessHandler_00922848;
    local_78 = 0;
    local_68.super_VectorView<unsigned_int>.buffer_size = 0;
    local_74 = 0;
    local_68.buffer_capacity = 8;
    local_80 = this;
    local_68.super_VectorView<unsigned_int>.ptr = (uint *)&local_68.stack_storage;
    SmallVector<unsigned_int,_8UL>::reserve(&local_68,1);
    uVar2 = local_74;
    *(uint32_t *)
     ((char *)local_68.super_VectorView<unsigned_int>.ptr +
     local_68.super_VectorView<unsigned_int>.buffer_size * 4) = uVar1;
    local_68.super_VectorView<unsigned_int>.buffer_size =
         local_68.super_VectorView<unsigned_int>.buffer_size + 1;
    bVar6 = local_c8._1_1_ ^ 1;
    if ((char)local_c8 != '\0') {
      bVar6 = 0;
    }
    local_74._7_1_ = SUB81(uVar2,7);
    local_74._0_7_ =
         CONCAT16(bVar6,CONCAT15(local_c8._1_1_,CONCAT14((char)local_c8,(undefined4)local_d0)));
    pSVar5 = Variant::get<diligent_spirv_cross::SPIRFunction>
                       ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                        (this->ir).default_entry_point.id);
    traverse_all_reachable_opcodes(this,pSVar5,&local_88);
    this->interlocked_is_complex =
         (bool)(local_74._6_1_ ^ 1 | (uint32_t)local_74 != (this->ir).default_entry_point.id);
    local_88._vptr_OpcodeHandler = (_func_int **)&PTR__InterlockedResourceAccessHandler_00922848;
    local_68.super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)local_68.super_VectorView<unsigned_int>.ptr !=
        &local_68.stack_storage) {
      free(local_68.super_VectorView<unsigned_int>.ptr);
    }
    local_e0._vptr_OpcodeHandler =
         (_func_int **)&PTR__InterlockedResourceAccessPrepassHandler_009228b8;
    local_c0.super_VectorView<unsigned_int>.buffer_size = 0;
    if ((AlignedBuffer<unsigned_int,_8UL> *)local_c0.super_VectorView<unsigned_int>.ptr !=
        &local_c0.stack_storage) {
      free(local_c0.super_VectorView<unsigned_int>.ptr);
    }
  }
  return;
}

Assistant:

void Compiler::analyze_interlocked_resource_usage()
{
	if (get_execution_model() == ExecutionModelFragment &&
	    (get_entry_point().flags.get(ExecutionModePixelInterlockOrderedEXT) ||
	     get_entry_point().flags.get(ExecutionModePixelInterlockUnorderedEXT) ||
	     get_entry_point().flags.get(ExecutionModeSampleInterlockOrderedEXT) ||
	     get_entry_point().flags.get(ExecutionModeSampleInterlockUnorderedEXT)))
	{
		InterlockedResourceAccessPrepassHandler prepass_handler(*this, ir.default_entry_point);
		traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), prepass_handler);

		InterlockedResourceAccessHandler handler(*this, ir.default_entry_point);
		handler.interlock_function_id = prepass_handler.interlock_function_id;
		handler.split_function_case = prepass_handler.split_function_case;
		handler.control_flow_interlock = prepass_handler.control_flow_interlock;
		handler.use_critical_section = !handler.split_function_case && !handler.control_flow_interlock;

		traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);

		// For GLSL. If we hit any of these cases, we have to fall back to conservative approach.
		interlocked_is_complex =
		    !handler.use_critical_section || handler.interlock_function_id != ir.default_entry_point;
	}
}